

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

ExecutionModel __thiscall spvtools::opt::IRContext::GetStage(IRContext *this)

{
  bool bVar1;
  ExecutionModel EVar2;
  Instruction *pIVar3;
  allocator<char> local_89;
  string local_88;
  IteratorRange<spvtools::opt::InstructionList::iterator> local_68;
  undefined1 local_58 [16];
  iterator_template<spvtools::opt::Instruction> local_48;
  iterator it;
  undefined1 local_30 [4];
  uint32_t stage;
  IteratorRange<spvtools::opt::InstructionList::iterator> *local_20;
  IteratorRange<spvtools::opt::InstructionList::iterator> *entry_points;
  IRContext *this_local;
  
  entry_points = (IteratorRange<spvtools::opt::InstructionList::iterator> *)this;
  module(this);
  Module::entry_points((Module *)local_30);
  local_20 = (IteratorRange<spvtools::opt::InstructionList::iterator> *)local_30;
  bVar1 = IteratorRange<spvtools::opt::InstructionList::iterator>::empty(local_20);
  if (bVar1) {
    this_local._4_4_ = ExecutionModelMax;
  }
  else {
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&it);
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->(&it.super_iterator);
    EVar2 = opt::Instruction::GetSingleWordInOperand(pIVar3,0);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)(local_58 + 8));
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)local_58);
    local_68.end_.super_iterator.node_._4_4_ = EVar2;
    std::find_if<spvtools::opt::InstructionList::iterator,spvtools::opt::IRContext::GetStage()::__0>
              ((iterator *)&local_48,(iterator *)(local_58 + 8),
               (anon_class_4_1_a8a4b21e_for__M_pred)(uint32_t)local_58);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end(&local_68);
    bVar1 = utils::operator!=(&local_48,(iterator_template<spvtools::opt::Instruction> *)&local_68);
    this_local._4_4_ = EVar2;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Mixed stage shader module not supported",&local_89);
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&local_48);
      EmitErrorMessage(this,&local_88,pIVar3);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  return this_local._4_4_;
}

Assistant:

spv::ExecutionModel IRContext::GetStage() {
  const auto& entry_points = module()->entry_points();
  if (entry_points.empty()) {
    return spv::ExecutionModel::Max;
  }

  uint32_t stage = entry_points.begin()->GetSingleWordInOperand(
      kEntryPointExecutionModelInIdx);
  auto it = std::find_if(
      entry_points.begin(), entry_points.end(), [stage](const Instruction& x) {
        return x.GetSingleWordInOperand(kEntryPointExecutionModelInIdx) !=
               stage;
      });
  if (it != entry_points.end()) {
    EmitErrorMessage("Mixed stage shader module not supported", &(*it));
  }

  return static_cast<spv::ExecutionModel>(stage);
}